

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O0

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  char *pcVar5;
  char *dir;
  long lVar6;
  undefined1 auVar7 [16];
  char local_238 [8];
  char buffer [100];
  string coutput;
  size_type last;
  size_type first;
  undefined1 local_198 [7];
  bool result;
  string output;
  int retVal;
  bool verbose;
  string local_150 [8];
  string command;
  string local_128;
  undefined4 local_108;
  allocator local_101;
  string local_100;
  ulong local_e0;
  size_t i;
  undefined1 local_d0 [7];
  bool havereturn_variable;
  string return_variable;
  undefined1 local_a8 [7];
  bool haveoutput_variable;
  string output_variable;
  int count;
  bool doingargs;
  string arguments;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExecProgramCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&count);
    output_variable.field_2._M_local_buf[0xf] = '\0';
    output_variable.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_a8);
    return_variable.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_d0);
    i._7_1_ = 0;
    for (local_e0 = 0; uVar4 = local_e0,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local), uVar4 < sVar2; local_e0 = local_e0 + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,local_e0);
      bVar1 = std::operator==(pvVar3,"OUTPUT_VARIABLE");
      if (bVar1) {
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        output_variable.field_2._M_local_buf[0xf] = '\0';
        i._7_1_ = 0;
        return_variable.field_2._M_local_buf[0xf] = '\x01';
      }
      else if ((return_variable.field_2._M_local_buf[0xf] & 1U) == 0) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,local_e0);
        bVar1 = std::operator==(pvVar3,"RETURN_VALUE");
        if (bVar1) {
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          output_variable.field_2._M_local_buf[0xf] = '\0';
          return_variable.field_2._M_local_buf[0xf] = '\0';
          i._7_1_ = 1;
        }
        else if ((i._7_1_ & 1) == 0) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,local_e0);
          bVar1 = std::operator==(pvVar3,"ARGS");
          if (bVar1) {
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
            i._7_1_ = 0;
            return_variable.field_2._M_local_buf[0xf] = '\0';
            output_variable.field_2._M_local_buf[0xf] = '\x01';
          }
          else if ((output_variable.field_2._M_local_buf[0xf] & 1U) != 0) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,local_e0);
            std::__cxx11::string::operator+=((string *)&count,(string *)pvVar3);
            std::__cxx11::string::operator+=((string *)&count," ");
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          }
        }
        else {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_128,"called with incorrect number of arguments",
                       (allocator *)(command.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(command.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 0;
            local_108 = 1;
            goto LAB_00701ae9;
          }
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,local_e0);
          std::__cxx11::string::operator=((string *)local_d0,(string *)pvVar3);
          i._7_1_ = 0;
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        }
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_100,"called with incorrect number of arguments",&local_101);
          cmCommand::SetError(&this->super_cmCommand,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
          this_local._7_1_ = 0;
          local_108 = 1;
          goto LAB_00701ae9;
        }
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,local_e0);
        std::__cxx11::string::operator=((string *)local_a8,(string *)pvVar3);
        return_variable.field_2._M_local_buf[0xf] = '\0';
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
      }
    }
    std::__cxx11::string::string(local_150);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,0);
      auVar7 = std::__cxx11::string::c_str();
      cmSystemTools::ConvertToRunCommandPath_abi_cxx11_((string *)&retVal,auVar7._0_8_,auVar7._8_8_)
      ;
      std::__cxx11::string::operator=(local_150,(string *)&retVal);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::operator+=(local_150," ");
      std::__cxx11::string::operator+=(local_150,(string *)&count);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      std::__cxx11::string::operator=(local_150,(string *)pvVar3);
    }
    output.field_2._M_local_buf[0xf] = '\x01';
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      output.field_2._M_local_buf[0xf] = '\0';
    }
    output.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_198);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar2 - (long)(int)output_variable.field_2._8_4_ == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,1);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar5);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,1);
      dir = (char *)std::__cxx11::string::c_str();
      first._7_1_ = RunCommand(pcVar5,(string *)local_198,(int *)(output.field_2._M_local_buf + 8),
                               dir,(bool)(output.field_2._M_local_buf[0xf] & 1));
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      first._7_1_ = RunCommand(pcVar5,(string *)local_198,(int *)(output.field_2._M_local_buf + 8),
                               (char *)0x0,(bool)(output.field_2._M_local_buf[0xf] & 1));
    }
    if (first._7_1_ == false) {
      output.field_2._8_4_ = 0xffffffff;
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      last = std::__cxx11::string::find_first_not_of(local_198,0xa8f384);
      coutput.field_2._8_8_ = std::__cxx11::string::find_last_not_of(local_198,0xa8f384);
      if (last == 0xffffffffffffffff) {
        last = 0;
      }
      if (coutput.field_2._8_8_ == -1) {
        lVar6 = std::__cxx11::string::size();
        coutput.field_2._8_8_ = lVar6 + -1;
      }
      std::__cxx11::string::string
                ((string *)(buffer + 0x60),(string *)local_198,last,
                 (coutput.field_2._8_8_ - last) + 1);
      this_00 = (this->super_cmCommand).Makefile;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,(string *)local_a8,pcVar5);
      std::__cxx11::string::~string((string *)(buffer + 0x60));
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      sprintf(local_238,"%d",(ulong)(uint)output.field_2._8_4_);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_d0,local_238);
    }
    this_local._7_1_ = 1;
    local_108 = 1;
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string(local_150);
LAB_00701ae9:
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&count);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExecProgramCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "OUTPUT_VARIABLE")
      {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
      }
    else if ( haveoutput_variable )
      {
      if (!output_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      output_variable = args[i];
      haveoutput_variable = false;
      count ++;
      }
    else if(args[i] == "RETURN_VALUE")
      {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
      }
    else if ( havereturn_variable )
      {
      if (!return_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      return_variable = args[i];
      havereturn_variable = false;
      count ++;
      }
    else if(args[i] == "ARGS")
      {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
      }
    else if(doingargs)
      {
      arguments += args[i];
      arguments += " ";
      count++;
      }
    }

  std::string command;
  if(!arguments.empty())
    {
    command = cmSystemTools::ConvertToRunCommandPath(args[0].c_str());
    command += " ";
    command += arguments;
    }
  else
    {
    command = args[0];
    }
  bool verbose = true;
  if(!output_variable.empty())
    {
    verbose = false;
    }
  int retVal = 0;
  std::string output;
  bool result = true;
  if(args.size() - count == 2)
    {
    cmSystemTools::MakeDirectory(args[1].c_str());
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
    }
  else
    {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output,
                                              retVal, 0, verbose);
    }
  if(!result)
    {
    retVal = -1;
    }

  if (!output_variable.empty())
    {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if(first == std::string::npos)
      {
      first = 0;
      }
    if(last == std::string::npos)
      {
      last = output.size()-1;
      }

    std::string coutput = std::string(output, first, last-first+1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
    }

  if (!return_variable.empty())
    {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
    }

  return true;
}